

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::UniformGridMediumProvider,pbrt::Bounds3<float>,pstd::optional<pbrt::SampledGrid<float>>,pstd::optional<pbrt::SampledGrid<pbrt::RGB>>,pbrt::RGBColorSpace_const*&,pbrt::SpectrumHandle&,pbrt::SampledGrid<float>,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,UniformGridMediumProvider *p,Bounds3<float> *args,
          optional<pbrt::SampledGrid<float>_> *args_1,
          optional<pbrt::SampledGrid<pbrt::RGB>_> *args_2,RGBColorSpace **args_3,
          SpectrumHandle *args_4,SampledGrid<float> *args_5,polymorphic_allocator<std::byte> *args_6
          )

{
  RGBColorSpace *colorSpace;
  aligned_storage_t<sizeof(pbrt::SampledGrid<pbrt::RGB>),_alignof(pbrt::SampledGrid<pbrt::RGB>)>
  local_c8;
  char local_98;
  aligned_storage_t<sizeof(pbrt::SampledGrid<float>),_alignof(pbrt::SampledGrid<float>)> local_90;
  char local_60;
  SampledGrid<float> local_58;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_28;
  
  optional<pbrt::SampledGrid<float>_>::optional
            ((optional<pbrt::SampledGrid<float>_> *)&local_90.__align,args_1);
  optional<pbrt::SampledGrid<pbrt::RGB>_>::optional
            ((optional<pbrt::SampledGrid<pbrt::RGB>_> *)&local_c8.__align,args_2);
  colorSpace = *args_3;
  local_28.bits =
       (args_4->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  local_58.values.alloc.memoryResource = (args_5->values).alloc.memoryResource;
  local_58.values.nAlloc = (args_5->values).nAlloc;
  local_58.values.nStored = (args_5->values).nStored;
  local_58.values.ptr = (args_5->values).ptr;
  (args_5->values).ptr = (float *)SUB168(ZEXT816(0) << 0x20,0);
  (args_5->values).nAlloc = SUB168(ZEXT816(0) << 0x20,8);
  (args_5->values).nStored = 0;
  local_58.nz = args_5->nz;
  local_58.nx = args_5->nx;
  local_58.ny = args_5->ny;
  pbrt::UniformGridMediumProvider::UniformGridMediumProvider
            (p,args,(optional<pbrt::SampledGrid<float>_> *)&local_90.__align,
             (optional<pbrt::SampledGrid<pbrt::RGB>_> *)&local_c8.__align,colorSpace,
             (SpectrumHandle *)&local_28,&local_58,args_6->memoryResource);
  local_58.values.nStored = 0;
  (*(local_58.values.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_58.values.alloc.memoryResource,local_58.values.ptr,local_58.values.nAlloc << 2,4)
  ;
  if (local_98 == '\x01') {
    local_c8._24_8_ = 0;
    (**(code **)(*(long *)local_c8.__align + 0x18))
              (local_c8.__align,local_c8._8_8_,local_c8._16_8_ * 0xc,4);
    local_98 = '\0';
  }
  if (local_60 == '\x01') {
    local_90._24_8_ = 0;
    (**(code **)(*(long *)local_90.__align + 0x18))
              (local_90.__align,local_90._8_8_,local_90._16_8_ << 2,4);
  }
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }